

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_tanh>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [24];
  long *in_RDI;
  float fVar31;
  float fVar32;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tanh op;
  Mat *m;
  __m256 two;
  __m256 one;
  __m256 one_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_3;
  __m128 one_4;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined1 local_1730 [16];
  undefined1 local_1720 [32];
  int local_16fc;
  undefined8 local_16f8;
  undefined8 local_16f0;
  undefined8 local_16e8;
  undefined4 local_16e0;
  long local_16d8;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined4 local_16c4;
  undefined4 local_16c0;
  undefined8 local_16b8;
  undefined1 (*local_16b0) [32];
  int local_16a8;
  int local_16a4;
  int local_16a0;
  int local_169c;
  int local_1698;
  int local_1694;
  int local_1690;
  undefined1 local_1689 [9];
  long *local_1680;
  undefined1 local_1675;
  int local_1674;
  undefined8 *local_1668;
  undefined8 *local_1660;
  undefined8 *local_1650;
  undefined1 (*local_1648) [32];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined1 (*local_1610) [32];
  undefined1 (*local_1608) [32];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined1 (*local_15f0) [32];
  long local_15e8;
  undefined4 local_15dc;
  long local_15d8;
  undefined1 (*local_15d0) [32];
  undefined4 local_15c4;
  int local_15c0;
  int local_15bc;
  undefined8 *local_15b8;
  undefined4 local_15ac;
  long local_15a8;
  undefined8 *local_1598;
  undefined1 *local_1570;
  undefined1 *local_1568;
  undefined1 *local_1560;
  undefined1 *local_1558;
  undefined1 (*local_1550) [32];
  undefined1 *local_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [32];
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined1 local_1400 [16];
  undefined1 auStack_13f0 [16];
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13d8;
  undefined4 local_13d4;
  undefined4 local_13d0;
  undefined4 local_13cc;
  undefined4 local_13c8;
  undefined4 local_13c4;
  undefined1 local_13c0 [16];
  undefined1 auStack_13b0 [16];
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  undefined4 local_138c;
  undefined4 local_1388;
  undefined4 local_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  ulong uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [32];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [8];
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [32];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 *local_1018;
  undefined8 *local_1010;
  float *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float *local_fb8;
  undefined1 *local_fb0;
  float *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float *local_f58;
  undefined1 *local_f50;
  float *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float *local_ef8;
  undefined1 *local_ef0;
  float *local_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float *local_e98;
  undefined1 *local_e90;
  float *local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float *local_e38;
  undefined1 *local_e30;
  float *local_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float *local_dd8;
  float *local_dd0;
  undefined1 *local_dc8;
  float local_dc0 [2];
  float afStack_db8 [2];
  float afStack_db0 [2];
  float afStack_da8 [2];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined1 *local_d78;
  float *local_d70;
  undefined1 *local_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 *local_cd8;
  float *local_cd0;
  undefined1 *local_cc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80 [2];
  float afStack_c78 [2];
  float afStack_c70 [2];
  float afStack_c68 [2];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40 [2];
  float afStack_c38 [2];
  float afStack_c30 [2];
  float afStack_c28 [2];
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  undefined4 uStack_c04;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  float local_bc0 [2];
  float afStack_bb8 [2];
  float afStack_bb0 [2];
  float afStack_ba8 [2];
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80 [2];
  float afStack_b78 [2];
  float afStack_b70 [2];
  float afStack_b68 [2];
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  float local_b00 [2];
  float afStack_af8 [2];
  float afStack_af0 [2];
  float afStack_ae8 [2];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined4 local_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined4 local_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined4 local_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined4 local_634;
  undefined8 local_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  ulong uStack_5f8;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined1 local_510 [16];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined1 local_4f0 [16];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined4 local_474;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 *local_368;
  float *local_360;
  undefined1 *local_358;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 *local_308;
  float *local_300;
  undefined1 *local_2f8;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 *local_2a8;
  undefined8 *local_2a0;
  float *local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float *local_1e8;
  undefined1 *local_1e0;
  float *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float *local_188;
  undefined1 *local_180;
  float *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float *local_128;
  undefined1 *local_120;
  float *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float *local_c8;
  undefined1 *local_c0;
  float *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90 [2];
  float afStack_88 [2];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_54;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  undefined1 local_40 [16];
  
  local_1690 = *(int *)((long)in_RDI + 0x2c);
  local_1694 = (int)in_RDI[6];
  local_1698 = *(int *)((long)in_RDI + 0x34);
  local_169c = (int)in_RDI[7];
  local_16a0 = (int)in_RDI[3];
  local_16a4 = local_1690 * local_1694 * local_1698 * local_16a0;
  local_1680 = in_RDI;
  for (local_16a8 = 0; local_16a8 < local_169c; local_16a8 = local_16a8 + 1) {
    local_1668 = &local_16f8;
    local_15bc = *(int *)((long)local_1680 + 0x2c);
    local_15c0 = (int)local_1680[6];
    local_15c4 = *(undefined4 *)((long)local_1680 + 0x34);
    local_15d0 = (undefined1 (*) [32])
                 (*local_1680 + local_1680[8] * (long)local_16a8 * local_1680[2]);
    local_15d8 = local_1680[2];
    local_15dc = (undefined4)local_1680[3];
    local_15e8 = local_1680[4];
    local_15b8 = &local_16f8;
    local_15a8 = (long)local_15bc * (long)local_15c0 * local_15d8;
    local_1660 = &local_16f8;
    local_1650 = &local_16f8;
    local_15ac = 0x10;
    local_1674 = local_16a8;
    local_1675 = 1;
    local_16f8 = 0;
    local_16e8 = 0;
    local_16e0 = 0;
    local_16d0 = 0;
    local_16cc = 0;
    local_16c8 = 0;
    local_16c4 = 0;
    local_16c0 = 0;
    local_16b8 = 0;
    local_16f0 = 0;
    local_16b0 = local_15d0;
    for (local_16fc = 0; local_16fc + 7 < local_16a4; local_16fc = local_16fc + 8) {
      local_1648 = local_16b0;
      auVar6 = *local_16b0;
      local_1568 = local_1689;
      local_1570 = local_1720;
      local_1720._0_8_ = auVar6._0_8_;
      local_1500 = local_1720._0_8_;
      local_1720._8_8_ = auVar6._8_8_;
      uStack_14f8 = local_1720._8_8_;
      local_1720._16_8_ = auVar6._16_8_;
      uStack_14f0 = local_1720._16_8_;
      local_1720._24_8_ = auVar6._24_8_;
      uStack_14e8 = local_1720._24_8_;
      local_1404 = 0x3f800000;
      local_13e0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1400 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_13f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1520 = local_1400._0_8_;
      uStack_1518 = local_1400._8_8_;
      uStack_1510 = auStack_13f0._0_8_;
      uStack_1508 = auStack_13f0._8_8_;
      local_1408 = 0x40000000;
      local_13a0 = 0x40000000;
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      local_13c0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      auStack_13b0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      local_1540 = local_13c0._0_8_;
      uStack_1538 = local_13c0._8_8_;
      uStack_1530 = auStack_13b0._0_8_;
      uStack_1528 = auStack_13b0._8_8_;
      local_1440._0_4_ = auVar6._0_4_;
      local_1440._4_4_ = auVar6._4_4_;
      uStack_1438._0_4_ = auVar6._8_4_;
      uStack_1438._4_4_ = auVar6._12_4_;
      uStack_1430._0_4_ = auVar6._16_4_;
      uStack_1430._4_4_ = auVar6._20_4_;
      uStack_1428._0_4_ = auVar6._24_4_;
      uStack_1428._4_4_ = auVar6._28_4_;
      uStack_1344 = uStack_1428._4_4_;
      local_1460._0_4_ = local_13c0._0_4_;
      local_1460._4_4_ = local_13c0._4_4_;
      uStack_1458._0_4_ = local_13c0._8_4_;
      uStack_1458._4_4_ = local_13c0._12_4_;
      uStack_1450._0_4_ = auStack_13b0._0_4_;
      uStack_1450._4_4_ = auStack_13b0._4_4_;
      uStack_1448._0_4_ = auStack_13b0._8_4_;
      local_1360 = (float)local_1440 * (float)local_1460;
      fStack_135c = local_1440._4_4_ * local_1460._4_4_;
      fStack_1358 = (float)uStack_1438 * (float)uStack_1458;
      fStack_1354 = uStack_1438._4_4_ * uStack_1458._4_4_;
      fStack_1350 = (float)uStack_1430 * (float)uStack_1450;
      fStack_134c = uStack_1430._4_4_ * uStack_1450._4_4_;
      fStack_1348 = (float)uStack_1428 * (float)uStack_1448;
      local_784 = 0x3f800000;
      local_720 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_740 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_730 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1380 = local_740._0_8_;
      uStack_1378 = local_740._8_8_;
      uStack_1370 = auStack_730._0_8_;
      uStack_1368 = auStack_730._8_8_;
      local_760._16_8_ = auStack_730._0_8_;
      local_760._0_16_ = local_740;
      local_760._24_8_ = auStack_730._8_8_;
      local_1140 = ZEXT832(0) << 0x20;
      local_1320 = 0;
      local_1300._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1318 = local_1300._8_8_;
      uStack_1310 = 0;
      uStack_1308 = 0;
      local_1340 = CONCAT44(fStack_135c,local_1360);
      uStack_1338 = CONCAT44(fStack_1354,fStack_1358);
      uStack_1330 = CONCAT44(fStack_134c,fStack_1350);
      uStack_1328 = CONCAT44(uStack_1428._4_4_,fStack_1348);
      auVar4._8_8_ = uStack_1338;
      auVar4._0_8_ = local_1340;
      auVar4._16_8_ = uStack_1330;
      auVar4._24_8_ = uStack_1328;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_1300._8_8_) << 0x40,auVar4);
      local_1280 = 0x3f8000003f800000;
      uStack_1278 = 0x3f8000003f800000;
      uStack_1270 = 0x3f8000003f800000;
      uStack_1268 = 0x3f8000003f800000;
      local_1200._0_8_ = auVar6._0_8_;
      local_1080 = local_1200._0_8_;
      local_1200._8_8_ = auVar6._8_8_;
      uStack_1078 = local_1200._8_8_;
      local_1200._16_8_ = auVar6._16_8_;
      uStack_1070 = local_1200._16_8_;
      local_1200._24_8_ = auVar6._24_8_;
      uStack_1068 = local_1200._24_8_;
      local_10a0 = 0x42b0c0a542b0c0a5;
      uStack_1098 = 0x42b0c0a542b0c0a5;
      uStack_1090 = 0x42b0c0a542b0c0a5;
      uStack_1088 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = 0x42b0c0a542b0c0a5;
      auVar5._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5._16_8_ = 0x42b0c0a542b0c0a5;
      auVar5._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar5);
      local_1200._0_8_ = auVar6._0_8_;
      local_1040 = local_1200._0_8_;
      local_1200._8_8_ = auVar6._8_8_;
      uStack_1038 = local_1200._8_8_;
      local_1200._16_8_ = auVar6._16_8_;
      uStack_1030 = local_1200._16_8_;
      local_1200._24_8_ = auVar6._24_8_;
      uStack_1028 = local_1200._24_8_;
      local_1060 = 0xc2b0c0a5c2b0c0a5;
      uStack_1058 = 0xc2b0c0a5c2b0c0a5;
      uStack_1050 = 0xc2b0c0a5c2b0c0a5;
      uStack_1048 = 0xc2b0c0a5c2b0c0a5;
      auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar12);
      local_1018 = local_1200;
      local_dd0 = ::_ps256_cephes_LOG2EF;
      local_dd8 = ::_ps256_0p5;
      local_1200._0_8_ = auVar4._0_8_;
      uVar7 = local_1200._0_8_;
      local_1200._8_8_ = auVar4._8_8_;
      uVar8 = local_1200._8_8_;
      local_1200._16_8_ = auVar4._16_8_;
      uVar9 = local_1200._16_8_;
      local_1200._24_8_ = auVar4._24_8_;
      uVar10 = local_1200._24_8_;
      local_dc0[0] = 1.442695;
      local_dc0[1] = 1.442695;
      afStack_db8[0] = 1.442695;
      afStack_db8[1] = 1.442695;
      afStack_db0[0] = 1.442695;
      afStack_db0[1] = 1.442695;
      afStack_da8[0] = 1.442695;
      afStack_da8[1] = 1.442695;
      local_da0._0_4_ = auVar4._0_4_;
      local_da0._4_4_ = auVar4._4_4_;
      uStack_d98._0_4_ = auVar4._8_4_;
      uStack_d98._4_4_ = auVar4._12_4_;
      uStack_d90._0_4_ = auVar4._16_4_;
      uStack_d90._4_4_ = auVar4._20_4_;
      uStack_d88._0_4_ = auVar4._24_4_;
      uStack_c04 = 0x3fb8aa3b;
      local_c20 = (float)local_da0 * 1.442695;
      fStack_c1c = local_da0._4_4_ * 1.442695;
      fStack_c18 = (float)uStack_d98 * 1.442695;
      fStack_c14 = uStack_d98._4_4_ * 1.442695;
      fStack_c10 = (float)uStack_d90 * 1.442695;
      fStack_c0c = uStack_d90._4_4_ * 1.442695;
      fStack_c08 = (float)uStack_d88 * 1.442695;
      local_c40[0] = 0.5;
      local_c40[1] = 0.5;
      afStack_c38[0] = 0.5;
      afStack_c38[1] = 0.5;
      afStack_c30[0] = 0.5;
      afStack_c30[1] = 0.5;
      afStack_c28[0] = 0.5;
      afStack_c28[1] = 0.5;
      local_1240._4_4_ = fStack_c1c + 0.5;
      local_1240._0_4_ = local_c20 + 0.5;
      uStack_1238._0_4_ = fStack_c18 + 0.5;
      uStack_1238._4_4_ = fStack_c14 + 0.5;
      uStack_1230._0_4_ = fStack_c10 + 0.5;
      uStack_1230._4_4_ = fStack_c0c + 0.5;
      uStack_1228._0_4_ = fStack_c08 + 0.5;
      uStack_1228._4_4_ = 0x3ff8aa3b;
      auVar5 = vroundps_avx(_local_1240,1);
      auVar6 = vcmpps_avx(_local_1240,auVar5,1);
      local_12a0._0_8_ = auVar6._0_8_;
      local_11a0 = local_12a0._0_8_;
      local_12a0._8_8_ = auVar6._8_8_;
      uStack_1198 = local_12a0._8_8_;
      local_12a0._16_8_ = auVar6._16_8_;
      uStack_1190 = local_12a0._16_8_;
      local_12a0._24_8_ = auVar6._24_8_;
      uStack_1188 = local_12a0._24_8_;
      local_11c0 = 0x3f8000003f800000;
      uStack_11b8 = 0x3f8000003f800000;
      uStack_11b0 = 0x3f8000003f800000;
      uStack_11a8 = 0x3f8000003f800000;
      auVar11._8_8_ = 0x3f8000003f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar11._16_8_ = 0x3f8000003f800000;
      auVar11._24_8_ = 0x3f8000003f800000;
      local_12a0 = vandps_avx(auVar6,auVar11);
      local_1220 = auVar5._0_8_;
      local_1160 = local_1220;
      uStack_1218 = auVar5._8_8_;
      uStack_1158 = uStack_1218;
      uStack_1210 = auVar5._16_8_;
      uStack_1150 = uStack_1210;
      uStack_1208 = auVar5._24_8_;
      uStack_1148 = uStack_1208;
      local_1180 = local_12a0._0_8_;
      uStack_1178 = local_12a0._8_8_;
      uStack_1170 = local_12a0._16_8_;
      uStack_1168 = local_12a0._24_8_;
      _local_1240 = vsubps_avx(auVar5,local_12a0);
      local_d68 = local_1240;
      local_cd0 = ::_ps256_cephes_exp_C1;
      local_ca0 = local_1200._0_8_;
      uStack_c98 = local_1200._8_8_;
      uStack_c90 = local_1200._16_8_;
      uStack_c88 = local_1200._24_8_;
      local_c80[0] = 0.6933594;
      local_c80[1] = 0.6933594;
      afStack_c78[0] = 0.6933594;
      afStack_c78[1] = 0.6933594;
      afStack_c70[0] = 0.6933594;
      afStack_c70[1] = 0.6933594;
      afStack_c68[0] = 0.6933594;
      afStack_c68[1] = 0.6933594;
      local_c60._0_4_ = local_1240._0_4_;
      local_c60._4_4_ = local_1240._4_4_;
      uStack_c58._0_4_ = local_1240._8_4_;
      uStack_c58._4_4_ = local_1240._12_4_;
      uStack_c50._0_4_ = local_1240._16_4_;
      uStack_c50._4_4_ = local_1240._20_4_;
      uStack_c48._0_4_ = local_1240._24_4_;
      uStack_c48._4_4_ = local_1240._28_4_;
      fStack_ca4 = uStack_c48._4_4_;
      local_cc0 = (float)local_c60 * 0.6933594;
      fStack_cbc = local_c60._4_4_ * 0.6933594;
      fStack_cb8 = (float)uStack_c58 * 0.6933594;
      fStack_cb4 = uStack_c58._4_4_ * 0.6933594;
      fStack_cb0 = (float)uStack_c50 * 0.6933594;
      fStack_cac = uStack_c50._4_4_ * 0.6933594;
      fStack_ca8 = (float)uStack_c48 * 0.6933594;
      auVar14._4_4_ = fStack_cbc;
      auVar14._0_4_ = local_cc0;
      auVar14._8_4_ = fStack_cb8;
      auVar14._12_4_ = fStack_cb4;
      auVar14._16_4_ = fStack_cb0;
      auVar14._20_4_ = fStack_cac;
      auVar14._24_4_ = fStack_ca8;
      auVar14._28_4_ = uStack_c48._4_4_;
      auVar6 = vsubps_avx(auVar4,auVar14);
      local_d70 = ::_ps256_cephes_exp_C2;
      local_1200._0_8_ = auVar6._0_8_;
      local_d40 = local_1200._0_8_;
      local_1200._8_8_ = auVar6._8_8_;
      uStack_d38 = local_1200._8_8_;
      local_1200._16_8_ = auVar6._16_8_;
      uStack_d30 = local_1200._16_8_;
      local_1200._24_8_ = auVar6._24_8_;
      uStack_d28 = local_1200._24_8_;
      local_d00 = local_1240;
      uStack_cf8 = uStack_1238;
      uStack_cf0 = uStack_1230;
      uStack_ce8 = uStack_1228;
      local_d20[0] = -0.00021219444;
      local_d20[1] = -0.00021219444;
      afStack_d18[0] = -0.00021219444;
      afStack_d18[1] = -0.00021219444;
      afStack_d10[0] = -0.00021219444;
      afStack_d10[1] = -0.00021219444;
      afStack_d08[0] = -0.00021219444;
      afStack_d08[1] = -0.00021219444;
      fStack_d44 = uStack_c48._4_4_;
      local_d60 = (float)local_c60 * -0.00021219444;
      fStack_d5c = local_c60._4_4_ * -0.00021219444;
      fStack_d58 = (float)uStack_c58 * -0.00021219444;
      fStack_d54 = uStack_c58._4_4_ * -0.00021219444;
      fStack_d50 = (float)uStack_c50 * -0.00021219444;
      fStack_d4c = uStack_c50._4_4_ * -0.00021219444;
      fStack_d48 = (float)uStack_c48 * -0.00021219444;
      auVar13._4_4_ = fStack_d5c;
      auVar13._0_4_ = local_d60;
      auVar13._8_4_ = fStack_d58;
      auVar13._12_4_ = fStack_d54;
      auVar13._16_4_ = fStack_d50;
      auVar13._20_4_ = fStack_d4c;
      auVar13._24_4_ = fStack_d48;
      auVar13._28_4_ = uStack_c48._4_4_;
      local_1200 = vsubps_avx(auVar6,auVar13);
      local_10e0 = local_1200._0_8_;
      uStack_10d8 = local_1200._8_8_;
      uStack_10d0 = local_1200._16_8_;
      uStack_10c8 = local_1200._24_8_;
      local_10c0._0_4_ = local_1200._0_4_;
      local_10c0._4_4_ = local_1200._4_4_;
      uStack_10b8._0_4_ = local_1200._8_4_;
      uStack_10b8._4_4_ = local_1200._12_4_;
      uStack_10b0._0_4_ = local_1200._16_4_;
      uStack_10b0._4_4_ = local_1200._20_4_;
      uStack_10a8._0_4_ = local_1200._24_4_;
      uStack_10a8._4_4_ = local_1200._28_4_;
      local_1220 = CONCAT44(local_10c0._4_4_ * local_10c0._4_4_,
                            (float)local_10c0 * (float)local_10c0);
      uStack_1218._0_4_ = (float)uStack_10b8 * (float)uStack_10b8;
      uStack_1218._4_4_ = uStack_10b8._4_4_ * uStack_10b8._4_4_;
      uStack_1210._0_4_ = (float)uStack_10b0 * (float)uStack_10b0;
      uStack_1210._4_4_ = uStack_10b0._4_4_ * uStack_10b0._4_4_;
      auVar30 = _local_1220;
      uStack_1208._0_4_ = (float)uStack_10a8 * (float)uStack_10a8;
      uStack_1208._4_4_ = uStack_10a8._4_4_;
      auVar4 = _local_1220;
      local_1008 = &local_12c0;
      local_e38 = ::_ps256_cephes_exp_p1;
      local_e00 = 0x3950696739506967;
      uStack_df8 = 0x3950696739506967;
      uStack_df0 = 0x3950696739506967;
      uStack_de8 = 0x3950696739506967;
      local_e20 = local_1200._0_8_;
      uStack_e18 = local_1200._8_8_;
      uStack_e10 = local_1200._16_8_;
      uStack_e08 = local_1200._24_8_;
      fStack_bc4 = uStack_10a8._4_4_;
      local_be0 = (float)local_10c0 * 0.00019875691;
      fStack_bdc = local_10c0._4_4_ * 0.00019875691;
      fStack_bd8 = (float)uStack_10b8 * 0.00019875691;
      fStack_bd4 = uStack_10b8._4_4_ * 0.00019875691;
      fStack_bd0 = (float)uStack_10b0 * 0.00019875691;
      fStack_bcc = uStack_10b0._4_4_ * 0.00019875691;
      fStack_bc8 = (float)uStack_10a8 * 0.00019875691;
      local_c00[0] = 0.0013981999;
      local_c00[1] = 0.0013981999;
      afStack_bf8[0] = 0.0013981999;
      afStack_bf8[1] = 0.0013981999;
      afStack_bf0[0] = 0.0013981999;
      afStack_bf0[1] = 0.0013981999;
      afStack_be8[0] = 0.0013981999;
      afStack_be8[1] = 0.0013981999;
      local_e98 = ::_ps256_cephes_exp_p2;
      local_e60 = CONCAT44(fStack_bdc + 0.0013981999,local_be0 + 0.0013981999);
      uStack_e58 = CONCAT44(fStack_bd4 + 0.0013981999,fStack_bd8 + 0.0013981999);
      uStack_e50 = CONCAT44(fStack_bcc + 0.0013981999,fStack_bd0 + 0.0013981999);
      uStack_e48 = CONCAT44(uStack_10a8._4_4_ + 0.0013981999,fStack_bc8 + 0.0013981999);
      local_e80 = local_1200._0_8_;
      uStack_e78 = local_1200._8_8_;
      uStack_e70 = local_1200._16_8_;
      uStack_e68 = local_1200._24_8_;
      fStack_b84 = uStack_10a8._4_4_;
      local_ba0 = (local_be0 + 0.0013981999) * (float)local_10c0;
      fStack_b9c = (fStack_bdc + 0.0013981999) * local_10c0._4_4_;
      fStack_b98 = (fStack_bd8 + 0.0013981999) * (float)uStack_10b8;
      fStack_b94 = (fStack_bd4 + 0.0013981999) * uStack_10b8._4_4_;
      fStack_b90 = (fStack_bd0 + 0.0013981999) * (float)uStack_10b0;
      fStack_b8c = (fStack_bcc + 0.0013981999) * uStack_10b0._4_4_;
      fStack_b88 = (fStack_bc8 + 0.0013981999) * (float)uStack_10a8;
      local_bc0[0] = 0.008333452;
      local_bc0[1] = 0.008333452;
      afStack_bb8[0] = 0.008333452;
      afStack_bb8[1] = 0.008333452;
      afStack_bb0[0] = 0.008333452;
      afStack_bb0[1] = 0.008333452;
      afStack_ba8[0] = 0.008333452;
      afStack_ba8[1] = 0.008333452;
      local_ef8 = ::_ps256_cephes_exp_p3;
      local_ec0 = CONCAT44(fStack_b9c + 0.008333452,local_ba0 + 0.008333452);
      uStack_eb8 = CONCAT44(fStack_b94 + 0.008333452,fStack_b98 + 0.008333452);
      uStack_eb0 = CONCAT44(fStack_b8c + 0.008333452,fStack_b90 + 0.008333452);
      uStack_ea8 = CONCAT44(uStack_10a8._4_4_ + 0.008333452,fStack_b88 + 0.008333452);
      local_ee0 = local_1200._0_8_;
      uStack_ed8 = local_1200._8_8_;
      uStack_ed0 = local_1200._16_8_;
      uStack_ec8 = local_1200._24_8_;
      fStack_b44 = uStack_10a8._4_4_;
      local_b60 = (local_ba0 + 0.008333452) * (float)local_10c0;
      fStack_b5c = (fStack_b9c + 0.008333452) * local_10c0._4_4_;
      fStack_b58 = (fStack_b98 + 0.008333452) * (float)uStack_10b8;
      fStack_b54 = (fStack_b94 + 0.008333452) * uStack_10b8._4_4_;
      fStack_b50 = (fStack_b90 + 0.008333452) * (float)uStack_10b0;
      fStack_b4c = (fStack_b8c + 0.008333452) * uStack_10b0._4_4_;
      fStack_b48 = (fStack_b88 + 0.008333452) * (float)uStack_10a8;
      local_b80[0] = 0.041665796;
      local_b80[1] = 0.041665796;
      afStack_b78[0] = 0.041665796;
      afStack_b78[1] = 0.041665796;
      afStack_b70[0] = 0.041665796;
      afStack_b70[1] = 0.041665796;
      afStack_b68[0] = 0.041665796;
      afStack_b68[1] = 0.041665796;
      local_f58 = ::_ps256_cephes_exp_p4;
      local_f20 = CONCAT44(fStack_b5c + 0.041665796,local_b60 + 0.041665796);
      uStack_f18 = CONCAT44(fStack_b54 + 0.041665796,fStack_b58 + 0.041665796);
      uStack_f10 = CONCAT44(fStack_b4c + 0.041665796,fStack_b50 + 0.041665796);
      uStack_f08 = CONCAT44(uStack_10a8._4_4_ + 0.041665796,fStack_b48 + 0.041665796);
      local_f40 = local_1200._0_8_;
      uStack_f38 = local_1200._8_8_;
      uStack_f30 = local_1200._16_8_;
      uStack_f28 = local_1200._24_8_;
      fStack_b04 = uStack_10a8._4_4_;
      local_b20 = (local_b60 + 0.041665796) * (float)local_10c0;
      fStack_b1c = (fStack_b5c + 0.041665796) * local_10c0._4_4_;
      fStack_b18 = (fStack_b58 + 0.041665796) * (float)uStack_10b8;
      fStack_b14 = (fStack_b54 + 0.041665796) * uStack_10b8._4_4_;
      fStack_b10 = (fStack_b50 + 0.041665796) * (float)uStack_10b0;
      fStack_b0c = (fStack_b4c + 0.041665796) * uStack_10b0._4_4_;
      fStack_b08 = (fStack_b48 + 0.041665796) * (float)uStack_10a8;
      local_b40[0] = 0.16666666;
      local_b40[1] = 0.16666666;
      afStack_b38[0] = 0.16666666;
      afStack_b38[1] = 0.16666666;
      afStack_b30[0] = 0.16666666;
      afStack_b30[1] = 0.16666666;
      afStack_b28[0] = 0.16666666;
      afStack_b28[1] = 0.16666666;
      local_fb8 = ::_ps256_cephes_exp_p5;
      local_f80 = CONCAT44(fStack_b1c + 0.16666666,local_b20 + 0.16666666);
      uStack_f78 = CONCAT44(fStack_b14 + 0.16666666,fStack_b18 + 0.16666666);
      uStack_f70 = CONCAT44(fStack_b0c + 0.16666666,fStack_b10 + 0.16666666);
      uStack_f68 = CONCAT44(uStack_10a8._4_4_ + 0.16666666,fStack_b08 + 0.16666666);
      local_fa0 = local_1200._0_8_;
      uStack_f98 = local_1200._8_8_;
      uStack_f90 = local_1200._16_8_;
      uStack_f88 = local_1200._24_8_;
      fStack_ac4 = uStack_10a8._4_4_;
      local_ae0 = (local_b20 + 0.16666666) * (float)local_10c0;
      fStack_adc = (fStack_b1c + 0.16666666) * local_10c0._4_4_;
      fStack_ad8 = (fStack_b18 + 0.16666666) * (float)uStack_10b8;
      fStack_ad4 = (fStack_b14 + 0.16666666) * uStack_10b8._4_4_;
      fStack_ad0 = (fStack_b10 + 0.16666666) * (float)uStack_10b0;
      fStack_acc = (fStack_b0c + 0.16666666) * uStack_10b0._4_4_;
      fStack_ac8 = (fStack_b08 + 0.16666666) * (float)uStack_10a8;
      local_b00[0] = 0.5;
      local_b00[1] = 0.5;
      afStack_af8[0] = 0.5;
      afStack_af8[1] = 0.5;
      afStack_af0[0] = 0.5;
      afStack_af0[1] = 0.5;
      afStack_ae8[0] = 0.5;
      afStack_ae8[1] = 0.5;
      local_1010 = &local_1220;
      local_fe0 = CONCAT44(fStack_adc + 0.5,local_ae0 + 0.5);
      uStack_fd8 = CONCAT44(fStack_ad4 + 0.5,fStack_ad8 + 0.5);
      uStack_fd0 = CONCAT44(fStack_acc + 0.5,fStack_ad0 + 0.5);
      uStack_fc8 = CONCAT44(uStack_10a8._4_4_ + 0.5,fStack_ac8 + 0.5);
      local_1000 = local_1220;
      uStack_ff8 = uStack_1218;
      uStack_1210 = auVar30._16_8_;
      uStack_ff0 = uStack_1210;
      uStack_1208 = auVar4._24_8_;
      uStack_fe8 = uStack_1208;
      fStack_a84 = uStack_10a8._4_4_;
      local_aa0 = (local_ae0 + 0.5) * (float)local_10c0 * (float)local_10c0;
      fStack_a9c = (fStack_adc + 0.5) * local_10c0._4_4_ * local_10c0._4_4_;
      fStack_a98 = (fStack_ad8 + 0.5) * (float)uStack_10b8 * (float)uStack_10b8;
      fStack_a94 = (fStack_ad4 + 0.5) * uStack_10b8._4_4_ * uStack_10b8._4_4_;
      fStack_a90 = (fStack_ad0 + 0.5) * (float)uStack_10b0 * (float)uStack_10b0;
      fStack_a8c = (fStack_acc + 0.5) * uStack_10b0._4_4_ * uStack_10b0._4_4_;
      fStack_a88 = (fStack_ac8 + 0.5) * (float)uStack_10a8 * (float)uStack_10a8;
      local_ac0 = local_1200._0_8_;
      uStack_ab8 = local_1200._8_8_;
      uStack_ab0 = local_1200._16_8_;
      uStack_aa8 = local_1200._24_8_;
      local_a60 = CONCAT44(fStack_a9c + local_10c0._4_4_,local_aa0 + (float)local_10c0);
      uStack_a58 = CONCAT44(fStack_a94 + uStack_10b8._4_4_,fStack_a98 + (float)uStack_10b8);
      uStack_a50 = CONCAT44(fStack_a8c + uStack_10b0._4_4_,fStack_a90 + (float)uStack_10b0);
      uStack_a48 = CONCAT44(uStack_10a8._4_4_ + uStack_10a8._4_4_,fStack_a88 + (float)uStack_10a8);
      local_a80 = 0x3f8000003f800000;
      uStack_a78 = 0x3f8000003f800000;
      uStack_a70 = 0x3f8000003f800000;
      uStack_a68 = 0x3f8000003f800000;
      local_12c0 = local_aa0 + (float)local_10c0 + 1.0;
      fStack_12bc = fStack_a9c + local_10c0._4_4_ + 1.0;
      fStack_12b8 = fStack_a98 + (float)uStack_10b8 + 1.0;
      fStack_12b4 = fStack_a94 + uStack_10b8._4_4_ + 1.0;
      fStack_12b0 = fStack_a90 + (float)uStack_10b0 + 1.0;
      fStack_12ac = fStack_a8c + uStack_10b0._4_4_ + 1.0;
      fStack_12a8 = fStack_a88 + (float)uStack_10a8 + 1.0;
      fStack_12a4 = uStack_10a8._4_4_ + uStack_10a8._4_4_ + 1.0;
      local_a00 = local_1240;
      uStack_9f8 = uStack_1238;
      uStack_9f0 = uStack_1230;
      uStack_9e8 = uStack_1228;
      local_1260 = CONCAT44((int)local_c60._4_4_,(int)(float)local_c60);
      uStack_1258 = CONCAT44((int)uStack_c58._4_4_,(int)(float)uStack_c58);
      uStack_1250 = CONCAT44((int)uStack_c50._4_4_,(int)(float)uStack_c50);
      uStack_1248 = CONCAT44((int)uStack_c48._4_4_,(int)(float)uStack_c48);
      local_900 = local_1260;
      uStack_8f8 = uStack_1258;
      uStack_8f0 = uStack_1250;
      uStack_8e8 = uStack_1248;
      local_920 = 0x7f0000007f;
      uStack_918 = 0x7f0000007f;
      uStack_910 = 0x7f0000007f;
      uStack_908 = 0x7f0000007f;
      local_9a0 = local_1260;
      uStack_998 = uStack_1258;
      uStack_990 = uStack_1250;
      uStack_988 = uStack_1248;
      local_9c0 = 0x7f0000007f;
      uStack_9b8 = 0x7f0000007f;
      uStack_9b0 = 0x7f0000007f;
      uStack_9a8 = 0x7f0000007f;
      local_950 = 0x7f0000007f;
      uStack_948 = 0x7f0000007f;
      local_960 = 0x7f0000007f;
      uStack_958 = 0x7f0000007f;
      local_7e0 = local_1260;
      uStack_7d8 = uStack_1258;
      local_7f0 = 0x7f0000007f;
      uStack_7e8 = 0x7f0000007f;
      auVar15._8_8_ = uStack_1258;
      auVar15._0_8_ = local_1260;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_930 = vpaddd_avx(auVar15,auVar3);
      local_800 = uStack_1250;
      uStack_7f8 = uStack_1248;
      local_810 = 0x7f0000007f;
      uStack_808 = 0x7f0000007f;
      auVar1._8_8_ = uStack_1248;
      auVar1._0_8_ = uStack_1250;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_940 = vpaddd_avx(auVar1,auVar2);
      local_9e0 = local_930._0_8_;
      uStack_9d8 = local_930._8_8_;
      uStack_9d0 = local_940._0_8_;
      uStack_9c8 = local_940._8_8_;
      local_980 = local_930._0_8_;
      uStack_978 = local_930._8_8_;
      uStack_970 = local_940._0_8_;
      uStack_968 = local_940._8_8_;
      local_840 = local_930._0_8_;
      uStack_838 = local_930._8_8_;
      uStack_830 = local_940._0_8_;
      uStack_828 = local_940._8_8_;
      local_844 = 0x17;
      local_8c0 = local_930._0_8_;
      uStack_8b8 = local_930._8_8_;
      uStack_8b0 = local_940._0_8_;
      uStack_8a8 = local_940._8_8_;
      local_7a0 = local_930._0_8_;
      uStack_798 = local_930._8_8_;
      local_7a4 = 0x17;
      local_860 = vpslld_avx(local_930,ZEXT416(0x17));
      local_7c0 = local_940._0_8_;
      uStack_7b8 = local_940._8_8_;
      local_7c4 = 0x17;
      local_870 = vpslld_avx(local_940,ZEXT416(0x17));
      local_8e0 = local_860._0_8_;
      uStack_8d8 = local_860._8_8_;
      uStack_8d0 = local_870._0_8_;
      uStack_8c8 = local_870._8_8_;
      local_8a0 = local_860._0_8_;
      uStack_898 = local_860._8_8_;
      uStack_890 = local_870._0_8_;
      uStack_888 = local_870._8_8_;
      local_1260 = local_860._0_8_;
      uStack_1258 = local_860._8_8_;
      uStack_1250 = local_870._0_8_;
      uStack_1248 = local_870._8_8_;
      local_11e0 = local_860._0_8_;
      uStack_11d8 = local_860._8_8_;
      uStack_11d0 = local_870._0_8_;
      uStack_11c8 = local_870._8_8_;
      local_12e0 = local_860._0_8_;
      uStack_12d8 = local_860._8_8_;
      uStack_12d0 = local_870._0_8_;
      uStack_12c8 = local_870._8_8_;
      local_1100._4_4_ = fStack_12bc;
      local_1100._0_4_ = local_12c0;
      local_1100._8_4_ = fStack_12b8;
      local_1100._12_4_ = fStack_12b4;
      local_1100._16_4_ = fStack_12b0;
      local_1100._20_4_ = fStack_12ac;
      local_1100._24_4_ = fStack_12a8;
      local_1100._28_4_ = fStack_12a4;
      local_1120._0_4_ = local_860._0_4_;
      local_1120._4_4_ = local_860._4_4_;
      uStack_1118._0_4_ = local_860._8_4_;
      uStack_1118._4_4_ = local_860._12_4_;
      uStack_1110._0_4_ = local_870._0_4_;
      uStack_1110._4_4_ = local_870._4_4_;
      uStack_1108._0_4_ = local_870._8_4_;
      local_12c0 = local_12c0 * (float)local_1120;
      fStack_12bc = fStack_12bc * local_1120._4_4_;
      fStack_12b8 = fStack_12b8 * (float)uStack_1118;
      fStack_12b4 = fStack_12b4 * uStack_1118._4_4_;
      fStack_12b0 = fStack_12b0 * (float)uStack_1110;
      fStack_12ac = fStack_12ac * uStack_1110._4_4_;
      fStack_12a8 = fStack_12a8 * (float)uStack_1108;
      local_a40 = CONCAT44(fStack_12bc,local_12c0);
      uStack_a38 = CONCAT44(fStack_12b4,fStack_12b8);
      uStack_a30 = CONCAT44(fStack_12ac,fStack_12b0);
      uStack_a28 = CONCAT44(fStack_12a4,fStack_12a8);
      local_a20._0_4_ = local_740._0_4_;
      local_a20._4_4_ = local_740._4_4_;
      fStack_a18 = local_740._8_4_;
      fStack_a14 = local_740._12_4_;
      fStack_a10 = auStack_730._0_4_;
      fStack_a0c = auStack_730._4_4_;
      fStack_a08 = auStack_730._8_4_;
      fStack_a04 = auStack_730._12_4_;
      local_780 = (float)local_a20._0_4_ + local_12c0;
      fStack_77c = (float)local_a20._4_4_ + fStack_12bc;
      fStack_778 = fStack_a18 + fStack_12b8;
      fStack_774 = fStack_a14 + fStack_12b4;
      fStack_770 = fStack_a10 + fStack_12b0;
      fStack_76c = fStack_a0c + fStack_12ac;
      fStack_768 = fStack_a08 + fStack_12a8;
      fStack_764 = fStack_a04 + fStack_12a4;
      auVar16._4_4_ = fStack_77c;
      auVar16._0_4_ = local_780;
      auVar16._8_4_ = fStack_778;
      auVar16._12_4_ = fStack_774;
      auVar16._16_4_ = fStack_770;
      auVar16._20_4_ = fStack_76c;
      auVar16._24_4_ = fStack_768;
      auVar16._28_4_ = fStack_764;
      _local_1480 = vdivps_avx(local_760,auVar16);
      local_14a0 = local_13c0._0_8_;
      uStack_1498 = local_13c0._8_8_;
      uStack_1490 = auStack_13b0._0_8_;
      uStack_1488 = auStack_13b0._8_8_;
      local_14c0._4_4_ = (float)local_1480._4_4_ * local_1460._4_4_;
      local_14c0._0_4_ = (float)local_1480._0_4_ * (float)local_1460;
      local_14c0._8_4_ = fStack_1478 * (float)uStack_1458;
      local_14c0._12_4_ = fStack_1474 * uStack_1458._4_4_;
      local_14c0._16_4_ = fStack_1470 * (float)uStack_1450;
      local_14c0._20_4_ = fStack_146c * uStack_1450._4_4_;
      local_14c0._24_4_ = fStack_1468 * (float)uStack_1448;
      local_14c0._28_4_ = local_1480._28_4_;
      local_14e0 = local_1400._0_8_;
      uStack_14d8 = local_1400._8_8_;
      uStack_14d0 = auStack_13f0._0_8_;
      uStack_14c8 = auStack_13f0._8_8_;
      auVar6._16_8_ = auStack_13f0._0_8_;
      auVar6._0_16_ = local_1400;
      auVar6._24_8_ = auStack_13f0._8_8_;
      local_1720 = vsubps_avx(local_14c0,auVar6);
      local_1610 = local_16b0;
      local_1640 = local_1720._0_8_;
      uStack_1638 = local_1720._8_8_;
      uStack_1630 = local_1720._16_8_;
      uStack_1628 = local_1720._24_8_;
      *local_16b0 = local_1720;
      local_16b0 = local_16b0 + 1;
      local_1460 = local_13c0._0_8_;
      uStack_1458 = local_13c0._8_8_;
      uStack_1450 = auStack_13b0._0_8_;
      uStack_1448 = auStack_13b0._8_8_;
      local_1440 = local_1500;
      uStack_1438 = uStack_14f8;
      uStack_1430 = uStack_14f0;
      uStack_1428 = uStack_14e8;
      local_13dc = local_13e0;
      local_13d8 = local_13e0;
      local_13d4 = local_13e0;
      local_13d0 = local_13e0;
      local_13cc = local_13e0;
      local_13c8 = local_13e0;
      local_13c4 = local_13e0;
      local_139c = local_13a0;
      local_1398 = local_13a0;
      local_1394 = local_13a0;
      local_1390 = local_13a0;
      local_138c = local_13a0;
      local_1388 = local_13a0;
      local_1384 = local_13a0;
      local_1300 = local_1140;
      _local_1220 = auVar4;
      local_1120 = local_860._0_8_;
      uStack_1118 = local_860._8_8_;
      uStack_1110 = local_870._0_8_;
      uStack_1108 = local_870._8_8_;
      local_10c0 = local_10e0;
      uStack_10b8 = uStack_10d8;
      uStack_10b0 = uStack_10d0;
      uStack_10a8 = uStack_10c8;
      local_fb0 = local_1018;
      local_fa8 = local_1008;
      local_f50 = local_1018;
      local_f48 = local_1008;
      local_ef0 = local_1018;
      local_ee8 = local_1008;
      local_e90 = local_1018;
      local_e88 = local_1008;
      local_e30 = local_1018;
      local_e28 = local_1008;
      local_dc8 = local_1018;
      local_da0 = uVar7;
      uStack_d98 = uVar8;
      uStack_d90 = uVar9;
      uStack_d88 = uVar10;
      local_d78 = local_1018;
      local_cd8 = local_1018;
      local_cc8 = local_d68;
      local_c60 = local_1240;
      uStack_c58 = uStack_1238;
      uStack_c50 = uStack_1230;
      uStack_c48 = uStack_1228;
      _local_a20 = local_760;
      local_71c = local_720;
      local_718 = local_720;
      local_714 = local_720;
      local_710 = local_720;
      local_70c = local_720;
      local_708 = local_720;
      local_704 = local_720;
    }
    for (; local_1598 = local_1650, local_16d8 = local_15e8, local_16fc + 3 < local_16a4;
        local_16fc = local_16fc + 4) {
      local_1608 = local_16b0;
      auVar2 = *(undefined1 (*) [16])*local_16b0;
      local_1558 = local_1689;
      local_1560 = local_1730;
      local_1730._0_8_ = auVar2._0_8_;
      local_6e0 = local_1730._0_8_;
      local_1730._8_8_ = auVar2._8_8_;
      uStack_6d8 = local_1730._8_8_;
      local_634 = 0x3f800000;
      local_650 = 0x3f800000;
      local_6f0 = 0x3f8000003f800000;
      uStack_6e8 = 0x3f8000003f800000;
      local_654 = 0x40000000;
      local_670 = 0x40000000;
      local_700 = 0x4000000040000000;
      uStack_6f8 = 0x4000000040000000;
      local_680._0_4_ = auVar2._0_4_;
      local_680._4_4_ = auVar2._4_4_;
      uStack_678._0_4_ = auVar2._8_4_;
      uStack_678._4_4_ = auVar2._12_4_;
      local_620 = (float)local_680 * 2.0;
      fStack_61c = local_680._4_4_ * 2.0;
      fStack_618 = (float)uStack_678 * 2.0;
      fStack_614 = uStack_678._4_4_ * 2.0;
      local_54 = 0x3f800000;
      local_70 = 0x3f800000;
      local_630 = 0x3f8000003f800000;
      uStack_628 = 0x3f8000003f800000;
      local_3d0._8_8_ = 0x3f8000003f800000;
      local_3d0._0_8_ = 0x3f8000003f800000;
      local_510 = ZEXT816(0) << 0x20;
      local_600 = 0;
      local_5f0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_5f8 = local_5f0._8_8_;
      local_610 = CONCAT44(fStack_61c,local_620);
      uStack_608 = CONCAT44(fStack_614,fStack_618);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_5f0._8_8_;
      auVar18._8_8_ = uStack_608;
      auVar18._0_8_ = local_610;
      auVar2 = vsubps_avx(auVar29 << 0x40,auVar18);
      local_5b0 = 0x3f8000003f800000;
      uStack_5a8 = 0x3f8000003f800000;
      local_570._0_8_ = auVar2._0_8_;
      local_450 = local_570._0_8_;
      local_570._8_8_ = auVar2._8_8_;
      uStack_448 = local_570._8_8_;
      local_460 = 0x42b0c0a542b0c0a5;
      uStack_458 = 0x42b0c0a542b0c0a5;
      auVar22._8_8_ = 0x42b0c0a542b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar22);
      local_570._0_8_ = auVar2._0_8_;
      local_430 = local_570._0_8_;
      local_570._8_8_ = auVar2._8_8_;
      uStack_428 = local_570._8_8_;
      local_440 = 0xc2b0c0a5c2b0c0a5;
      uStack_438 = 0xc2b0c0a5c2b0c0a5;
      auVar23._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar23);
      local_570._0_8_ = auVar3._0_8_;
      uVar7 = local_570._0_8_;
      local_570._8_8_ = auVar3._8_8_;
      uVar8 = local_570._8_8_;
      local_4c0 = 0x3fb8aa3b3fb8aa3b;
      uStack_4b8 = 0x3fb8aa3b3fb8aa3b;
      local_4b0._0_4_ = auVar3._0_4_;
      local_4b0._4_4_ = auVar3._4_4_;
      uStack_4a8._0_4_ = auVar3._8_4_;
      uStack_4a8._4_4_ = auVar3._12_4_;
      local_590._4_4_ = local_4b0._4_4_ * 1.442695;
      local_590._0_4_ = (float)local_4b0 * 1.442695;
      uStack_588._0_4_ = (float)uStack_4a8 * 1.442695;
      uStack_588._4_4_ = uStack_4a8._4_4_ * 1.442695;
      local_3f0 = local_590;
      uStack_3e8 = uStack_588;
      local_400 = 0x3f0000003f000000;
      uStack_3f8 = 0x3f0000003f000000;
      local_590._0_4_ = (float)local_4b0 * 1.442695 + 0.5;
      local_590._4_4_ = local_4b0._4_4_ * 1.442695 + 0.5;
      fVar31 = (float)uStack_4a8 * 1.442695 + 0.5;
      fVar32 = uStack_4a8._4_4_ * 1.442695 + 0.5;
      uStack_588._0_4_ = fVar31;
      uStack_588._4_4_ = fVar32;
      local_3b0 = local_590;
      uStack_3a8 = uStack_588;
      local_5a0._4_4_ = (int)(float)local_590._4_4_;
      local_5a0._0_4_ = (int)(float)local_590._0_4_;
      local_5a0._8_4_ = (int)fVar31;
      local_5a0._12_4_ = (int)fVar32;
      local_3a0 = local_5a0._0_8_;
      uStack_398 = local_5a0._8_8_;
      auVar24._8_8_ = local_5a0._8_8_;
      auVar24._0_8_ = local_5a0._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar24);
      local_580 = auVar1._0_8_;
      local_380 = local_580;
      uStack_578 = auVar1._8_8_;
      uStack_378 = uStack_578;
      local_390 = local_590;
      uStack_388 = uStack_588;
      auVar25._8_8_ = uStack_588;
      auVar25._0_8_ = local_590;
      auVar2 = vcmpps_avx(auVar25,auVar1,1);
      local_5c0._0_8_ = auVar2._0_8_;
      local_540 = local_5c0._0_8_;
      local_5c0._8_8_ = auVar2._8_8_;
      uStack_538 = local_5c0._8_8_;
      local_550 = 0x3f8000003f800000;
      uStack_548 = 0x3f8000003f800000;
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      local_5c0 = vpand_avx(auVar2,auVar19);
      local_520 = local_580;
      uStack_518 = uStack_578;
      local_530 = local_5c0._0_8_;
      uStack_528 = local_5c0._8_8_;
      _local_590 = vsubps_avx(auVar1,local_5c0);
      local_358 = local_590;
      local_300 = ::_ps_cephes_exp_C1;
      local_368 = local_570;
      local_2e0 = local_570._0_8_;
      uStack_2d8 = local_570._8_8_;
      local_2d0[0] = 0.6933594;
      local_2d0[1] = 0.6933594;
      afStack_2c8[0] = 0.6933594;
      afStack_2c8[1] = 0.6933594;
      local_2c0._0_4_ = local_590._0_4_;
      local_2c0._4_4_ = local_590._4_4_;
      uStack_2b8._0_4_ = local_590._8_4_;
      uStack_2b8._4_4_ = local_590._12_4_;
      local_2f0 = (float)local_2c0 * 0.6933594;
      fStack_2ec = local_2c0._4_4_ * 0.6933594;
      fStack_2e8 = (float)uStack_2b8 * 0.6933594;
      fStack_2e4 = uStack_2b8._4_4_ * 0.6933594;
      auVar27._4_4_ = fStack_2ec;
      auVar27._0_4_ = local_2f0;
      auVar27._8_4_ = fStack_2e8;
      auVar27._12_4_ = fStack_2e4;
      auVar2 = vsubps_avx(auVar3,auVar27);
      local_360 = ::_ps_cephes_exp_C2;
      local_570._0_8_ = auVar2._0_8_;
      local_340 = local_570._0_8_;
      local_570._8_8_ = auVar2._8_8_;
      uStack_338 = local_570._8_8_;
      local_320 = local_590;
      uStack_318 = uStack_588;
      local_330[0] = -0.00021219444;
      local_330[1] = -0.00021219444;
      afStack_328[0] = -0.00021219444;
      afStack_328[1] = -0.00021219444;
      local_350 = (float)local_2c0 * -0.00021219444;
      fStack_34c = local_2c0._4_4_ * -0.00021219444;
      fStack_348 = (float)uStack_2b8 * -0.00021219444;
      fStack_344 = uStack_2b8._4_4_ * -0.00021219444;
      auVar26._4_4_ = fStack_34c;
      auVar26._0_4_ = local_350;
      auVar26._8_4_ = fStack_348;
      auVar26._12_4_ = fStack_344;
      local_570 = vsubps_avx(auVar2,auVar26);
      local_4e0 = local_570._0_8_;
      uStack_4d8 = local_570._8_8_;
      local_4d0._0_4_ = local_570._0_4_;
      local_4d0._4_4_ = local_570._4_4_;
      uStack_4c8._0_4_ = local_570._8_4_;
      uStack_4c8._4_4_ = local_570._12_4_;
      local_580 = CONCAT44(local_4d0._4_4_ * local_4d0._4_4_,(float)local_4d0 * (float)local_4d0);
      uStack_578._0_4_ = (float)uStack_4c8 * (float)uStack_4c8;
      uStack_578._4_4_ = uStack_4c8._4_4_ * uStack_4c8._4_4_;
      local_298 = &local_5d0;
      local_c8 = ::_ps_cephes_exp_p1;
      local_a0 = 0x3950696739506967;
      uStack_98 = 0x3950696739506967;
      local_b0 = local_570._0_8_;
      uStack_a8 = local_570._8_8_;
      local_80 = (float)local_4d0 * 0.00019875691;
      fStack_7c = local_4d0._4_4_ * 0.00019875691;
      fStack_78 = (float)uStack_4c8 * 0.00019875691;
      fStack_74 = uStack_4c8._4_4_ * 0.00019875691;
      local_90[0] = 0.0013981999;
      local_90[1] = 0.0013981999;
      afStack_88[0] = 0.0013981999;
      afStack_88[1] = 0.0013981999;
      local_128 = ::_ps_cephes_exp_p2;
      local_100 = CONCAT44(fStack_7c + 0.0013981999,local_80 + 0.0013981999);
      uStack_f8 = CONCAT44(fStack_74 + 0.0013981999,fStack_78 + 0.0013981999);
      local_110 = local_570._0_8_;
      uStack_108 = local_570._8_8_;
      local_e0 = (local_80 + 0.0013981999) * (float)local_4d0;
      fStack_dc = (fStack_7c + 0.0013981999) * local_4d0._4_4_;
      fStack_d8 = (fStack_78 + 0.0013981999) * (float)uStack_4c8;
      fStack_d4 = (fStack_74 + 0.0013981999) * uStack_4c8._4_4_;
      local_f0[0] = 0.008333452;
      local_f0[1] = 0.008333452;
      afStack_e8[0] = 0.008333452;
      afStack_e8[1] = 0.008333452;
      local_188 = ::_ps_cephes_exp_p3;
      local_160 = CONCAT44(fStack_dc + 0.008333452,local_e0 + 0.008333452);
      uStack_158 = CONCAT44(fStack_d4 + 0.008333452,fStack_d8 + 0.008333452);
      local_170 = local_570._0_8_;
      uStack_168 = local_570._8_8_;
      local_140 = (local_e0 + 0.008333452) * (float)local_4d0;
      fStack_13c = (fStack_dc + 0.008333452) * local_4d0._4_4_;
      fStack_138 = (fStack_d8 + 0.008333452) * (float)uStack_4c8;
      fStack_134 = (fStack_d4 + 0.008333452) * uStack_4c8._4_4_;
      local_150[0] = 0.041665796;
      local_150[1] = 0.041665796;
      afStack_148[0] = 0.041665796;
      afStack_148[1] = 0.041665796;
      local_1e8 = ::_ps_cephes_exp_p4;
      local_1c0 = CONCAT44(fStack_13c + 0.041665796,local_140 + 0.041665796);
      uStack_1b8 = CONCAT44(fStack_134 + 0.041665796,fStack_138 + 0.041665796);
      local_1d0 = local_570._0_8_;
      uStack_1c8 = local_570._8_8_;
      local_1a0 = (local_140 + 0.041665796) * (float)local_4d0;
      fStack_19c = (fStack_13c + 0.041665796) * local_4d0._4_4_;
      fStack_198 = (fStack_138 + 0.041665796) * (float)uStack_4c8;
      fStack_194 = (fStack_134 + 0.041665796) * uStack_4c8._4_4_;
      local_1b0[0] = 0.16666666;
      local_1b0[1] = 0.16666666;
      afStack_1a8[0] = 0.16666666;
      afStack_1a8[1] = 0.16666666;
      local_248 = ::_ps_cephes_exp_p5;
      local_220 = CONCAT44(fStack_19c + 0.16666666,local_1a0 + 0.16666666);
      uStack_218 = CONCAT44(fStack_194 + 0.16666666,fStack_198 + 0.16666666);
      local_230 = local_570._0_8_;
      uStack_228 = local_570._8_8_;
      local_200 = (local_1a0 + 0.16666666) * (float)local_4d0;
      fStack_1fc = (fStack_19c + 0.16666666) * local_4d0._4_4_;
      fStack_1f8 = (fStack_198 + 0.16666666) * (float)uStack_4c8;
      fStack_1f4 = (fStack_194 + 0.16666666) * uStack_4c8._4_4_;
      local_210[0] = 0.5;
      local_210[1] = 0.5;
      afStack_208[0] = 0.5;
      afStack_208[1] = 0.5;
      local_2a0 = &local_580;
      local_280 = CONCAT44(fStack_1fc + 0.5,local_200 + 0.5);
      uStack_278 = CONCAT44(fStack_1f4 + 0.5,fStack_1f8 + 0.5);
      local_290 = local_580;
      uStack_288 = uStack_578;
      local_260 = (local_200 + 0.5) * (float)local_4d0 * (float)local_4d0;
      fStack_25c = (fStack_1fc + 0.5) * local_4d0._4_4_ * local_4d0._4_4_;
      fStack_258 = (fStack_1f8 + 0.5) * (float)uStack_4c8 * (float)uStack_4c8;
      fStack_254 = (fStack_1f4 + 0.5) * uStack_4c8._4_4_ * uStack_4c8._4_4_;
      local_270 = local_570._0_8_;
      uStack_268 = local_570._8_8_;
      local_410 = CONCAT44(fStack_25c + local_4d0._4_4_,local_260 + (float)local_4d0);
      uStack_408 = CONCAT44(fStack_254 + uStack_4c8._4_4_,fStack_258 + (float)uStack_4c8);
      local_420 = 0x3f8000003f800000;
      uStack_418 = 0x3f8000003f800000;
      local_5d0 = local_260 + (float)local_4d0 + 1.0;
      fStack_5cc = fStack_25c + local_4d0._4_4_ + 1.0;
      fStack_5c8 = fStack_258 + (float)uStack_4c8 + 1.0;
      fStack_5c4 = fStack_254 + uStack_4c8._4_4_ + 1.0;
      local_3c0 = local_590;
      uStack_3b8 = uStack_588;
      local_5a0._4_4_ = (int)local_2c0._4_4_;
      local_5a0._0_4_ = (int)(float)local_2c0;
      local_5a0._8_4_ = (int)(float)uStack_2b8;
      local_5a0._12_4_ = (int)uStack_2b8._4_4_;
      local_490 = local_5a0._0_8_;
      uStack_488 = local_5a0._8_8_;
      local_4a0 = 0x7f0000007f;
      uStack_498 = 0x7f0000007f;
      auVar21._8_8_ = local_5a0._8_8_;
      auVar21._0_8_ = local_5a0._0_8_;
      auVar20._8_8_ = 0x7f0000007f;
      auVar20._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar21,auVar20);
      local_5a0._0_8_ = auVar2._0_8_;
      local_470 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar2._8_8_;
      uStack_468 = local_5a0._8_8_;
      local_474 = 0x17;
      local_5a0 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_560 = local_5a0._0_8_;
      uStack_558 = local_5a0._8_8_;
      local_5e0 = local_5a0._0_8_;
      uStack_5d8 = local_5a0._8_8_;
      local_4f0._4_4_ = fStack_5cc;
      local_4f0._0_4_ = local_5d0;
      local_4f0._8_4_ = fStack_5c8;
      local_4f0._12_4_ = fStack_5c4;
      local_500._0_4_ = local_5a0._0_4_;
      local_500._4_4_ = local_5a0._4_4_;
      uStack_4f8._0_4_ = local_5a0._8_4_;
      uStack_4f8._4_4_ = local_5a0._12_4_;
      local_5d0 = local_5d0 * (float)local_500;
      fStack_5cc = fStack_5cc * local_500._4_4_;
      fStack_5c8 = fStack_5c8 * (float)uStack_4f8;
      fStack_5c4 = fStack_5c4 * uStack_4f8._4_4_;
      local_3e0 = CONCAT44(fStack_5cc,local_5d0);
      uStack_3d8 = CONCAT44(fStack_5c4,fStack_5c8);
      local_50 = local_5d0 + 1.0;
      fStack_4c = fStack_5cc + 1.0;
      fStack_48 = fStack_5c8 + 1.0;
      fStack_44 = fStack_5c4 + 1.0;
      auVar28._4_4_ = fStack_4c;
      auVar28._0_4_ = local_50;
      auVar28._8_4_ = fStack_48;
      auVar28._12_4_ = fStack_44;
      _local_6a0 = vdivps_avx(local_3d0,auVar28);
      local_6c0._0_4_ = (float)local_6a0._0_4_ * 2.0;
      local_6c0._4_4_ = (float)local_6a0._4_4_ * 2.0;
      local_6c0._8_4_ = fStack_698 * 2.0;
      local_6c0._12_4_ = fStack_694 * 2.0;
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      local_1730 = vsubps_avx(local_6c0,auVar17);
      local_15f0 = local_16b0;
      local_1600 = local_1730._0_8_;
      uStack_15f8 = local_1730._8_8_;
      *(undefined1 (*) [16])*local_16b0 = local_1730;
      local_16b0 = (undefined1 (*) [32])(*local_16b0 + 0x10);
      local_6d0 = local_6f0;
      uStack_6c8 = uStack_6e8;
      local_6b0 = local_700;
      uStack_6a8 = uStack_6f8;
      local_690 = local_700;
      uStack_688 = uStack_6f8;
      local_680 = local_6e0;
      uStack_678 = uStack_6d8;
      uStack_66c = local_670;
      uStack_668 = local_670;
      uStack_664 = local_670;
      uStack_64c = local_650;
      uStack_648 = local_650;
      uStack_644 = local_650;
      local_5f0 = local_510;
      local_500 = local_5a0._0_8_;
      uStack_4f8 = local_5a0._8_8_;
      local_4d0 = local_4e0;
      uStack_4c8 = uStack_4d8;
      local_4b0 = uVar7;
      uStack_4a8 = uVar8;
      local_308 = local_368;
      local_2f8 = local_358;
      local_2c0 = local_590;
      uStack_2b8 = uStack_588;
      local_2a8 = local_368;
      local_240 = local_368;
      local_238 = local_298;
      local_1e0 = local_368;
      local_1d8 = local_298;
      local_180 = local_368;
      local_178 = local_298;
      local_120 = local_368;
      local_118 = local_298;
      local_c0 = local_368;
      local_b8 = local_298;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      local_40 = local_3d0;
    }
    for (; local_16fc < local_16a4; local_16fc = local_16fc + 1) {
      local_1548 = local_1689;
      local_1550 = local_16b0;
      fVar31 = tanhf(*(float *)*local_16b0);
      *(float *)*local_16b0 = fVar31;
      local_16b0 = (undefined1 (*) [32])(*local_16b0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}